

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

TCGv_i32 gen_sub32_carry32(TCGContext_conflict8 *tcg_ctx)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *pTVar1;
  
  ts = tcg_temp_new_internal_sparc64(tcg_ctx,TCG_TYPE_I32,false);
  ts_00 = tcg_temp_new_internal_sparc64(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_extrl_i64_i32_sparc64(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),tcg_ctx->cpu_cc_src);
  tcg_gen_extrl_i64_i32_sparc64
            (tcg_ctx,(TCGv_i32)((long)ts_00 - (long)tcg_ctx),tcg_ctx->cpu_cc_src2);
  pTVar1 = tcg_temp_new_internal_sparc64(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_setcond_i32_sparc64
            (tcg_ctx,TCG_COND_LTU,(TCGv_i32)((long)pTVar1 - (long)tcg_ctx),
             (TCGv_i32)((long)ts - (long)tcg_ctx),(TCGv_i32)((long)ts_00 - (long)tcg_ctx));
  tcg_temp_free_internal_sparc64(tcg_ctx,ts);
  tcg_temp_free_internal_sparc64(tcg_ctx,ts_00);
  return (TCGv_i32)((long)pTVar1 - (long)tcg_ctx);
}

Assistant:

static TCGv_i32 gen_sub32_carry32(TCGContext *tcg_ctx)
{
    TCGv_i32 carry_32, cc_src1_32, cc_src2_32;

    /* Carry is computed from a previous borrow: (src1 < src2)  */
#if TARGET_LONG_BITS == 64
    cc_src1_32 = tcg_temp_new_i32(tcg_ctx);
    cc_src2_32 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32(tcg_ctx, cc_src1_32, tcg_ctx->cpu_cc_src);
    tcg_gen_extrl_i64_i32(tcg_ctx, cc_src2_32, tcg_ctx->cpu_cc_src2);
#else
    cc_src1_32 = tcg_ctx->cpu_cc_src;
    cc_src2_32 = tcg_ctx->cpu_cc_src2;
#endif

    carry_32 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_setcond_i32(tcg_ctx, TCG_COND_LTU, carry_32, cc_src1_32, cc_src2_32);

#if TARGET_LONG_BITS == 64
    tcg_temp_free_i32(tcg_ctx, cc_src1_32);
    tcg_temp_free_i32(tcg_ctx, cc_src2_32);
#endif

    return carry_32;
}